

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::extractClassName(Catch *this,string *classOrQualifiedMethodName)

{
  bool bVar1;
  string local_88 [32];
  long local_68;
  size_t penultimateColons;
  size_t lastColons;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  string *local_18;
  string *classOrQualifiedMethodName_local;
  string *className;
  
  local_19 = 0;
  local_18 = classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = (string *)this;
  std::__cxx11::string::string((string *)this,(string *)classOrQualifiedMethodName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"&",&local_41);
  bVar1 = startsWith((string *)this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    penultimateColons = std::__cxx11::string::rfind((char *)this,0x165f28);
    local_68 = std::__cxx11::string::rfind((char *)this,0x165f28);
    if (local_68 == -1) {
      local_68 = 1;
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_88);
    std::__cxx11::string::~string(local_88);
  }
  return this;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( startsWith( className, "&" ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }